

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O2

void hputl(char *hstring,char *keyword,int lval)

{
  undefined2 uVar1;
  undefined8 in_RAX;
  char value [8];
  
  uVar1 = 0x54;
  if (lval == 0) {
    uVar1 = 0x46;
  }
  value._2_6_ = (undefined6)((ulong)in_RAX >> 0x10);
  value[0] = (char)uVar1;
  value[1] = (char)((ushort)uVar1 >> 8);
  hputc(hstring,keyword,value);
  return;
}

Assistant:

static void
hputl (hstring, keyword,lval)

char *hstring;		/* FITS header */
char *keyword;		/* Keyword name */
int lval;		/* logical variable (0=false, else true) */
{
    char value[8];

    /* Translate value from binary to ASCII */
    if (lval)
	strcpy (value, "T");
    else
	strcpy (value, "F");

    /* Put value into header string */
    hputc (hstring,keyword,value);

    /* Return to calling program */
    return;
}